

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CoreMLModels::WordTagger::MergePartialFromCodedStream
          (WordTagger *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  short extraout_AX;
  short extraout_AX_00;
  short extraout_AX_01;
  short extraout_AX_02;
  short extraout_AX_03;
  short sVar5;
  short extraout_AX_04;
  short extraout_AX_05;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  StringVector *this_00;
  ulong extraout_RAX;
  uint uVar9;
  ulong uVar10;
  int local_74;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar9 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = (uint)bVar2, (~(uint)*pbVar1 & uVar9) < 0x80)
           ) goto LAB_0027d3f4;
        uVar9 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = (ulong)uVar9 | 0x100000000;
    }
    else {
LAB_0027d3f4:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar10 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar8 | uVar10;
    }
    uVar9 = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto LAB_0027d2f4;
    uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
    iVar7 = local_74;
    if (uVar6 < 100) {
      switch(uVar6) {
      case 0x14:
        MergePartialFromCodedStream();
        sVar5 = extraout_AX_00;
        break;
      case 0x15:
        MergePartialFromCodedStream();
        sVar5 = extraout_AX_03;
        break;
      case 0x16:
        MergePartialFromCodedStream();
        sVar5 = extraout_AX_01;
        break;
      case 0x17:
        MergePartialFromCodedStream();
        sVar5 = extraout_AX_02;
        break;
      default:
        if (uVar6 == 1) {
          MergePartialFromCodedStream();
          sVar5 = extraout_AX_04;
          goto LAB_0027d3d5;
        }
        if (uVar6 != 10) goto LAB_0027d2f4;
        MergePartialFromCodedStream();
        sVar5 = extraout_AX;
      }
      if (sVar5 == 0) goto LAB_0027d2f4;
      if (sVar5 != 1) goto LAB_0027d321;
LAB_0027d31f:
      iVar7 = 0;
    }
    else if (uVar6 == 200) {
      if ((char)uVar10 != 'B') goto LAB_0027d2f4;
      if (this->_oneof_case_[0] != 200) {
        this->_oneof_case_[0] = 200;
        this_00 = (StringVector *)operator_new(0x30);
        StringVector::StringVector(this_00);
        (this->Tags_).stringtags_ = this_00;
      }
      MergePartialFromCodedStream();
      if ((extraout_RAX & 1) == 0) goto LAB_0027d31f;
    }
    else {
      if (uVar6 == 100) {
        MergePartialFromCodedStream();
        sVar5 = extraout_AX_05;
LAB_0027d3d5:
        if (sVar5 != 0) {
          iVar7 = 6;
          if (sVar5 == 1) goto LAB_0027d31f;
          goto LAB_0027d321;
        }
      }
LAB_0027d2f4:
      iVar7 = 7;
      if ((uVar9 & 7) != 4 && uVar9 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar9);
        if (bVar4) goto LAB_0027d31f;
        iVar7 = 6;
      }
    }
LAB_0027d321:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool WordTagger::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.WordTagger)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 revision = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &revision_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string language = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_language()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->language().data(), this->language().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.language"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokensOutputFeatureName = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokensoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokensoutputfeaturename().data(), this->tokensoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenTagsOutputFeatureName = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokentagsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokentagsoutputfeaturename().data(), this->tokentagsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenLocationsOutputFeatureName = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokenlocationsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokenlocationsoutputfeaturename().data(), this->tokenlocationsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenLengthsOutputFeatureName = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokenlengthsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokenlengthsoutputfeaturename().data(), this->tokenlengthsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes modelParameterData = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_modelparameterdata()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringTags = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringtags()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.WordTagger)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.WordTagger)
  return false;
#undef DO_
}